

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Value::isInt64(Value *this)

{
  char cVar1;
  double *in_RDI;
  bool local_21;
  bool local_1;
  
  cVar1 = *(char *)(in_RDI + 1);
  if (cVar1 == '\x01') {
    local_1 = true;
  }
  else if (cVar1 == '\x02') {
    local_1 = (ulong)*in_RDI < 0x8000000000000000;
  }
  else if (cVar1 == '\x03') {
    local_21 = false;
    if ((-9.223372036854776e+18 <= *in_RDI) &&
       (local_21 = false, *in_RDI <= 9.223372036854776e+18 && *in_RDI != 9.223372036854776e+18)) {
      local_21 = IsIntegral((double)in_RDI);
    }
    local_1 = local_21;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Value::isInt64() const {
#if defined(JSON_HAS_INT64)
  switch (type_) {
  case intValue:
    return true;
  case uintValue:
    return value_.uint_ <= UInt64(maxInt64);
  case realValue:
    // Note that maxInt64 (= 2^63 - 1) is not exactly representable as a
    // double, so double(maxInt64) will be rounded up to 2^63. Therefore we
    // require the value to be strictly less than the limit.
    return value_.real_ >= double(minInt64) &&
           value_.real_ < double(maxInt64) && IsIntegral(value_.real_);
  default:
    break;
  }
#endif // JSON_HAS_INT64
  return false;
}